

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editorsmodel.cpp
# Opt level: O0

int __thiscall EditorsModel::emptyRow(EditorsModel *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QModelIndex local_c0;
  undefined1 local_a8 [24];
  QVariant local_90;
  QString local_70;
  QModelIndex local_58;
  int local_40;
  byte local_39;
  int c;
  bool empty;
  int local_1c;
  EditorsModel *pEStack_18;
  int r;
  EditorsModel *this_local;
  
  local_1c = 0;
  pEStack_18 = this;
  do {
    iVar1 = local_1c;
    QModelIndex::QModelIndex((QModelIndex *)&c);
    iVar4 = (**(code **)(*(long *)this + 0x78))(this,&c);
    if (iVar4 <= iVar1) {
      return -1;
    }
    local_39 = 1;
    local_40 = 0;
    while( true ) {
      iVar1 = local_40;
      QModelIndex::QModelIndex(&local_58);
      iVar5 = (**(code **)(*(long *)this + 0x80))(this,&local_58);
      iVar2 = local_1c;
      iVar4 = local_40;
      if (iVar5 <= iVar1) break;
      QModelIndex::QModelIndex(&local_c0);
      (**(code **)(*(long *)this + 0x60))(local_a8,this,iVar2,iVar4,&local_c0);
      (**(code **)(*(long *)this + 0x90))(&local_90,this,local_a8,0);
      QVariant::toString();
      bVar3 = QString::isEmpty(&local_70);
      QString::~QString(&local_70);
      QVariant::~QVariant(&local_90);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        local_39 = 0;
        break;
      }
      local_40 = local_40 + 1;
    }
    if ((local_39 & 1) != 0) {
      return local_1c;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

int EditorsModel::emptyRow() const {
    for(int r=0;r<rowCount();r++) {
        bool empty = true;
        for (int c=0;c<columnCount();c++) {
            if (!data(index(r,c)).toString().isEmpty()) {
                empty = false;
                break;
            }
        }
        if (empty) {
            return r;
        }
    }
    return -1;
}